

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

bool __thiscall
AlternativeLoader::altCheckSection(AlternativeLoader *this,string *mode,string *line)

{
  char cVar1;
  ulong uVar2;
  
  cVar1 = *(line->_M_dataplus)._M_p;
  if (cVar1 == '[') {
    std::__cxx11::string::_M_replace((ulong)mode,0,(char *)mode->_M_string_length,0x13173a);
    if (line->_M_string_length - 3 < 0xfffffffffffffffe) {
      uVar2 = 1;
      do {
        if ((line->_M_dataplus)._M_p[uVar2] != ']') {
          std::__cxx11::string::push_back((char)mode);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < line->_M_string_length - 1);
    }
  }
  return cVar1 == '[';
}

Assistant:

void MapLoader::setMapFile(std::string newMapFile) {
    pMapFile = new std::string(std::move(newMapFile));
}